

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Array<wchar_t> * __thiscall
kj::PathPtr::forWin32Api(Array<wchar_t> *__return_storage_ptr__,PathPtr *this,bool absolute)

{
  char *pcVar1;
  char *pcVar2;
  ArrayPtr<const_char> text;
  Array<char> local_50;
  EncodingResult<kj::Array<wchar_t>_> local_38;
  
  toWin32StringImpl((String *)&local_50,this,absolute,true);
  pcVar2 = (char *)local_50.size_;
  if ((char *)local_50.size_ != (char *)0x0) {
    pcVar2 = local_50.ptr;
  }
  pcVar1 = (char *)0x0;
  if ((char *)local_50.size_ != (char *)0x0) {
    pcVar1 = (char *)(local_50.size_ + -1);
  }
  text.size_ = (size_t)pcVar1;
  text.ptr = pcVar2;
  encodeWideString(&local_38,text,true);
  __return_storage_ptr__->ptr = local_38.super_Array<wchar_t>.ptr;
  __return_storage_ptr__->size_ = local_38.super_Array<wchar_t>.size_;
  __return_storage_ptr__->disposer = local_38.super_Array<wchar_t>.disposer;
  local_38.super_Array<wchar_t>.ptr = (wchar_t *)0x0;
  local_38.super_Array<wchar_t>.size_ = 0;
  Array<wchar_t>::~Array(&local_38.super_Array<wchar_t>);
  Array<char>::~Array(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Array<wchar_t> PathPtr::forWin32Api(bool absolute) const {
  return encodeWideString(toWin32StringImpl(absolute, true), true);
}